

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fillInCell(MemPage *pPage,uchar *pCell,BtreePayload *pX,int *pnSize)

{
  Pgno parent;
  u8 eType_00;
  int iVar1;
  Pgno PVar2;
  bool bVar3;
  uint local_98;
  uint local_94;
  u8 eType;
  MemPage *pMStack_88;
  Pgno pgnoPtrmap;
  MemPage *pOvfl;
  int nHeader;
  Pgno pgnoOvfl;
  BtShared *pBt;
  uchar *pPayload;
  uchar *pPrior;
  MemPage *pToRelease;
  uint local_50;
  int spaceLeft;
  int mn;
  int rc;
  int n;
  int nSrc;
  u8 *pSrc;
  int *piStack_30;
  int nPayload;
  int *pnSize_local;
  BtreePayload *pX_local;
  uchar *pCell_local;
  MemPage *pPage_local;
  
  pOvfl._0_4_ = (uint)pPage->childPtrSize;
  piStack_30 = pnSize;
  pnSize_local = (int *)pX;
  pX_local = (BtreePayload *)pCell;
  pCell_local = &pPage->isInit;
  if (pPage->intKey == '\0') {
    rc = (int)pX->nKey;
    _n = pX->pKey;
    pSrc._4_4_ = rc;
    if ((uint)rc < 0x80) {
      pCell[(int)(uint)pOvfl] = (uchar)pX->nKey;
      local_98 = 1;
    }
    else {
      local_98 = sqlite3PutVarint(pCell + (int)(uint)pOvfl,(long)rc);
    }
    pOvfl._0_4_ = (local_98 & 0xff) + (uint)pOvfl;
  }
  else {
    pSrc._4_4_ = pX->nData + pX->nZero;
    _n = pX->pData;
    rc = pX->nData;
    if (pSrc._4_4_ < 0x80) {
      pCell[(int)(uint)pOvfl] = (uchar)pSrc._4_4_;
      local_94 = 1;
    }
    else {
      local_94 = sqlite3PutVarint(pCell + (int)(uint)pOvfl,(long)(int)pSrc._4_4_);
    }
    pOvfl._0_4_ = (local_94 & 0xff) + (uint)pOvfl;
    iVar1 = sqlite3PutVarint((uchar *)((long)&pX_local->pKey + (long)(int)(uint)pOvfl),
                             *(u64 *)(pnSize_local + 2));
    pOvfl._0_4_ = iVar1 + (uint)pOvfl;
  }
  pBt = (BtShared *)((long)&pX_local->pKey + (long)(int)(uint)pOvfl);
  if ((int)(uint)*(ushort *)(pCell_local + 0xe) < (int)pSrc._4_4_) {
    local_50 = (uint)*(ushort *)(pCell_local + 0x10);
    mn = local_50 + (pSrc._4_4_ - local_50) % (*(int *)(*(long *)(pCell_local + 0x48) + 0x38) - 4U);
    if ((int)(uint)*(ushort *)(pCell_local + 0xe) < mn) {
      mn = local_50;
    }
    pToRelease._4_4_ = mn;
    *piStack_30 = mn + (uint)pOvfl + 4;
    pPayload = (uchar *)((long)&pX_local->pKey + (long)(int)((uint)pOvfl + mn));
    pPrior = (uchar *)0x0;
    pOvfl._4_4_ = 0;
    _nHeader = *(BtShared **)(pCell_local + 0x48);
    while( true ) {
      mn = pSrc._4_4_;
      if (pToRelease._4_4_ < (int)pSrc._4_4_) {
        mn = pToRelease._4_4_;
      }
      if (rc < mn) {
        if (rc < 1) {
          memset(pBt,0,(long)mn);
        }
        else {
          mn = rc;
          memcpy(pBt,_n,(long)rc);
        }
      }
      else {
        memcpy(pBt,_n,(long)mn);
      }
      parent = pOvfl._4_4_;
      pSrc._4_4_ = pSrc._4_4_ - mn;
      if ((int)pSrc._4_4_ < 1) break;
      pBt = (BtShared *)((long)&pBt->pPager + (long)mn);
      _n = (void *)((long)_n + (long)mn);
      rc = rc - mn;
      pToRelease._4_4_ = pToRelease._4_4_ - mn;
      if (pToRelease._4_4_ == 0) {
        pMStack_88 = (MemPage *)0x0;
        pToRelease._4_4_ = 0;
        if (_nHeader->autoVacuum != '\0') {
          do {
            pOvfl._4_4_ = pOvfl._4_4_ + 1;
            PVar2 = ptrmapPageno(_nHeader,pOvfl._4_4_);
            bVar3 = true;
            if (PVar2 != pOvfl._4_4_) {
              bVar3 = pOvfl._4_4_ == (uint)sqlite3PendingByte / _nHeader->pageSize + 1;
            }
          } while (bVar3);
        }
        spaceLeft = allocateBtreePage(_nHeader,&stack0xffffffffffffff78,(Pgno *)((long)&pOvfl + 4),
                                      pOvfl._4_4_,'\0');
        if ((_nHeader->autoVacuum != '\0') && (spaceLeft == 0)) {
          eType_00 = '\x03';
          if (parent != 0) {
            eType_00 = '\x04';
          }
          ptrmapPut(_nHeader,pOvfl._4_4_,eType_00,parent,&spaceLeft);
          if (spaceLeft != 0) {
            releasePage(pMStack_88);
          }
        }
        if (spaceLeft != 0) {
          releasePage((MemPage *)pPrior);
          return spaceLeft;
        }
        sqlite3Put4byte(pPayload,pOvfl._4_4_);
        releasePage((MemPage *)pPrior);
        pPrior = &pMStack_88->isInit;
        pPayload = pMStack_88->aData;
        sqlite3Put4byte(pPayload,0);
        pBt = (BtShared *)(pMStack_88->aData + 4);
        pToRelease._4_4_ = _nHeader->usableSize - 4;
      }
    }
    releasePage((MemPage *)pPrior);
  }
  else {
    mn = (uint)pOvfl + pSrc._4_4_;
    if (mn < 4) {
      mn = 4;
    }
    *piStack_30 = mn;
    memcpy(pBt,_n,(long)rc);
    memset((void *)((long)&pBt->pPager + (long)rc),0,(long)(int)(pSrc._4_4_ - rc));
  }
  return 0;
}

Assistant:

static int fillInCell(
  MemPage *pPage,                /* The page that contains the cell */
  unsigned char *pCell,          /* Complete text of the cell */
  const BtreePayload *pX,        /* Payload with which to construct the cell */
  int *pnSize                    /* Write cell size here */
){
  int nPayload;
  const u8 *pSrc;
  int nSrc, n, rc, mn;
  int spaceLeft;
  MemPage *pToRelease;
  unsigned char *pPrior;
  unsigned char *pPayload;
  BtShared *pBt;
  Pgno pgnoOvfl;
  int nHeader;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );

  /* pPage is not necessarily writeable since pCell might be auxiliary
  ** buffer space that is separate from the pPage buffer area */
  assert( pCell<pPage->aData || pCell>=&pPage->aData[pPage->pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

  /* Fill in the header. */
  nHeader = pPage->childPtrSize;
  if( pPage->intKey ){
    nPayload = pX->nData + pX->nZero;
    pSrc = pX->pData;
    nSrc = pX->nData;
    assert( pPage->intKeyLeaf ); /* fillInCell() only called for leaves */
    nHeader += putVarint32(&pCell[nHeader], nPayload);
    nHeader += putVarint(&pCell[nHeader], *(u64*)&pX->nKey);
  }else{
    assert( pX->nKey<=0x7fffffff && pX->pKey!=0 );
    nSrc = nPayload = (int)pX->nKey;
    pSrc = pX->pKey;
    nHeader += putVarint32(&pCell[nHeader], nPayload);
  }

  /* Fill in the payload */
  pPayload = &pCell[nHeader];
  if( nPayload<=pPage->maxLocal ){
    /* This is the common case where everything fits on the btree page
    ** and no overflow pages are required. */
    n = nHeader + nPayload;
    testcase( n==3 );
    testcase( n==4 );
    if( n<4 ) n = 4;
    *pnSize = n;
    assert( nSrc<=nPayload );
    testcase( nSrc<nPayload );
    memcpy(pPayload, pSrc, nSrc);
    memset(pPayload+nSrc, 0, nPayload-nSrc);
    return SQLITE_OK;
  }

  /* If we reach this point, it means that some of the content will need
  ** to spill onto overflow pages.
  */
  mn = pPage->minLocal;
  n = mn + (nPayload - mn) % (pPage->pBt->usableSize - 4);
  testcase( n==pPage->maxLocal );
  testcase( n==pPage->maxLocal+1 );
  if( n > pPage->maxLocal ) n = mn;
  spaceLeft = n;
  *pnSize = n + nHeader + 4;
  pPrior = &pCell[nHeader+n];
  pToRelease = 0;
  pgnoOvfl = 0;
  pBt = pPage->pBt;

  /* At this point variables should be set as follows:
  **
  **   nPayload           Total payload size in bytes
  **   pPayload           Begin writing payload here
  **   spaceLeft          Space available at pPayload.  If nPayload>spaceLeft,
  **                      that means content must spill into overflow pages.
  **   *pnSize            Size of the local cell (not counting overflow pages)
  **   pPrior             Where to write the pgno of the first overflow page
  **
  ** Use a call to btreeParseCellPtr() to verify that the values above
  ** were computed correctly.
  */
#ifdef SQLITE_DEBUG
  {
    CellInfo info;
    pPage->xParseCell(pPage, pCell, &info);
    assert( nHeader==(int)(info.pPayload - pCell) );
    assert( info.nKey==pX->nKey );
    assert( *pnSize == info.nSize );
    assert( spaceLeft == info.nLocal );
  }
#endif

  /* Write the payload into the local Cell and any extra into overflow pages */
  while( 1 ){
    n = nPayload;
    if( n>spaceLeft ) n = spaceLeft;

    /* If pToRelease is not zero than pPayload points into the data area
    ** of pToRelease.  Make sure pToRelease is still writeable. */
    assert( pToRelease==0 || sqlite3PagerIswriteable(pToRelease->pDbPage) );

    /* If pPayload is part of the data area of pPage, then make sure pPage
    ** is still writeable */
    assert( pPayload<pPage->aData || pPayload>=&pPage->aData[pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

    if( nSrc>=n ){
      memcpy(pPayload, pSrc, n);
    }else if( nSrc>0 ){
      n = nSrc;
      memcpy(pPayload, pSrc, n);
    }else{
      memset(pPayload, 0, n);
    }
    nPayload -= n;
    if( nPayload<=0 ) break;
    pPayload += n;
    pSrc += n;
    nSrc -= n;
    spaceLeft -= n;
    if( spaceLeft==0 ){
      MemPage *pOvfl = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      Pgno pgnoPtrmap = pgnoOvfl; /* Overflow page pointer-map entry page */
      if( pBt->autoVacuum ){
        do{
          pgnoOvfl++;
        } while(
          PTRMAP_ISPAGE(pBt, pgnoOvfl) || pgnoOvfl==PENDING_BYTE_PAGE(pBt)
        );
      }
#endif
      rc = allocateBtreePage(pBt, &pOvfl, &pgnoOvfl, pgnoOvfl, 0);
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the database supports auto-vacuum, and the second or subsequent
      ** overflow page is being allocated, add an entry to the pointer-map
      ** for that page now.
      **
      ** If this is the first overflow page, then write a partial entry
      ** to the pointer-map. If we write nothing to this pointer-map slot,
      ** then the optimistic overflow chain processing in clearCell()
      ** may misinterpret the uninitialized values and delete the
      ** wrong pages from the database.
      */
      if( pBt->autoVacuum && rc==SQLITE_OK ){
        u8 eType = (pgnoPtrmap?PTRMAP_OVERFLOW2:PTRMAP_OVERFLOW1);
        ptrmapPut(pBt, pgnoOvfl, eType, pgnoPtrmap, &rc);
        if( rc ){
          releasePage(pOvfl);
        }
      }
#endif
      if( rc ){
        releasePage(pToRelease);
        return rc;
      }

      /* If pToRelease is not zero than pPrior points into the data area
      ** of pToRelease.  Make sure pToRelease is still writeable. */
      assert( pToRelease==0 || sqlite3PagerIswriteable(pToRelease->pDbPage) );

      /* If pPrior is part of the data area of pPage, then make sure pPage
      ** is still writeable */
      assert( pPrior<pPage->aData || pPrior>=&pPage->aData[pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

      put4byte(pPrior, pgnoOvfl);
      releasePage(pToRelease);
      pToRelease = pOvfl;
      pPrior = pOvfl->aData;
      put4byte(pPrior, 0);
      pPayload = &pOvfl->aData[4];
      spaceLeft = pBt->usableSize - 4;
    }
  }
  releasePage(pToRelease);
  return SQLITE_OK;
}